

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoleculeStamp.cpp
# Opt level: O3

void __thiscall OpenMD::MoleculeStamp::checkBends(MoleculeStamp *this)

{
  int iVar1;
  _Head_base<2UL,_int,_false> _Var2;
  _Head_base<1UL,_int,_false> _Var3;
  _Tuple_impl<2UL,_int> _Var4;
  long lVar5;
  pointer piVar6;
  pointer ppAVar7;
  AtomStamp *pAVar8;
  AtomStamp *pAVar9;
  pointer pcVar10;
  _Head_base<0UL,_int,_false> _Var11;
  bool bVar12;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var13;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var14;
  long lVar15;
  _Alloc_hider _Var16;
  pointer ppBVar17;
  iterator iVar18;
  pointer ppBVar19;
  BendStamp *pBVar20;
  _Rb_tree_node_base *p_Var21;
  ostream *poVar22;
  OpenMDException *pOVar23;
  int __tmp;
  pointer ppBVar24;
  vector<int,_std::allocator<int>_> *cont;
  vector<int,_std::allocator<int>_> *cont_00;
  vector<int,_std::allocator<int>_> *cont_01;
  vector<int,_std::allocator<int>_> *cont_02;
  long lVar25;
  ulong uVar26;
  set<std::tuple<int,_int,_int>,_std::less<std::tuple<int,_int,_int>_>,_std::allocator<std::tuple<int,_int,_int>_>_>
  allBends;
  size_t ghostIndex;
  vector<int,_std::allocator<int>_> bendAtoms;
  vector<int,_std::allocator<int>_> rigidSet;
  tuple<int,_int,_int> bendTuple;
  ostringstream oss;
  undefined1 local_250 [32];
  _Base_ptr local_230;
  size_t local_228;
  undefined1 local_220 [8];
  _Head_base<0UL,_int,_false> local_218;
  undefined4 uStack_214;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_210;
  string local_200;
  vector<int,_std::allocator<int>_> local_1e0;
  _Base_ptr local_1c8;
  key_type local_1bc;
  ulong local_1b0;
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  ppBVar17 = (this->bendStamps_).
             super__Vector_base<OpenMD::BendStamp_*,_std::allocator<OpenMD::BendStamp_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  ppBVar24 = (this->bendStamps_).
             super__Vector_base<OpenMD::BendStamp_*,_std::allocator<OpenMD::BendStamp_*>_>._M_impl.
             super__Vector_impl_data._M_finish;
  if (ppBVar24 != ppBVar17) {
    lVar25 = 0;
    uVar26 = 0;
    do {
      lVar5 = *(long *)((long)ppBVar17 + (lVar25 >> 0x1d));
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)&local_200,
                 (vector<int,_std::allocator<int>_> *)(lVar5 + 0x98));
      local_250._8_8_ =
           ((long)(this->atomStamps_).
                  super__Vector_base<OpenMD::AtomStamp_*,_std::allocator<OpenMD::AtomStamp_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)(this->atomStamps_).
                  super__Vector_base<OpenMD::AtomStamp_*,_std::allocator<OpenMD::AtomStamp_*>_>.
                  _M_impl.super__Vector_impl_data._M_start >> 3) - 1;
      _Var13 = std::
               __find_if<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_pred<std::_Bind<std::greater<int>(std::_Placeholder<1>,unsigned_long)>>>
                         (local_200._M_dataplus._M_p,local_200._M_string_length,local_250);
      local_250._0_8_ = (pointer)0x0;
      _Var14 = std::
               __find_if<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_pred<std::_Bind<std::less<int>(std::_Placeholder<1>,int)>>>
                         (local_200._M_dataplus._M_p,local_200._M_string_length,local_250);
      if ((_Var13._M_current != (int *)local_200._M_string_length) ||
         (_Var14._M_current != (int *)local_200._M_string_length)) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"Error in Molecule ",0x12);
        pcVar10 = (this->Name).data_._M_dataplus._M_p;
        local_250._0_8_ = local_250 + 0x10;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_250,pcVar10,pcVar10 + (this->Name).data_._M_string_length);
        poVar22 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1a8,(char *)local_250._0_8_,local_250._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>(poVar22," : atoms of bend",0x10);
        containerToString<std::vector<int,std::allocator<int>>>
                  ((string *)local_220,(OpenMD *)&local_200,cont_00);
        poVar22 = std::__ostream_insert<char,std::char_traits<char>>
                            (poVar22,(char *)local_220,CONCAT44(uStack_214,local_218._M_head_impl));
        std::__ostream_insert<char,std::char_traits<char>>(poVar22," have invalid indices\n",0x16);
        if (local_220 != (undefined1  [8])&local_210) {
          operator_delete((void *)local_220,local_210._M_allocated_capacity + 1);
        }
        if ((undefined1 *)local_250._0_8_ != local_250 + 0x10) {
          operator_delete((void *)local_250._0_8_,(ulong)(local_250._16_8_ + 1));
        }
        pOVar23 = (OpenMDException *)__cxa_allocate_exception(0x28);
        std::__cxx11::stringbuf::str();
        OpenMDException::OpenMDException(pOVar23,(string *)local_250);
        __cxa_throw(pOVar23,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
      }
      bVar12 = hasDuplicateElement<std::vector<int,std::allocator<int>>>
                         ((vector<int,_std::allocator<int>_> *)&local_200);
      if (bVar12) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"Error in Molecule ",0x12);
        pcVar10 = (this->Name).data_._M_dataplus._M_p;
        local_250._0_8_ = local_250 + 0x10;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_250,pcVar10,pcVar10 + (this->Name).data_._M_string_length);
        poVar22 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1a8,(char *)local_250._0_8_,local_250._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>(poVar22," : atoms of bend",0x10);
        containerToString<std::vector<int,std::allocator<int>>>
                  ((string *)local_220,(OpenMD *)&local_200,cont_01);
        poVar22 = std::__ostream_insert<char,std::char_traits<char>>
                            (poVar22,(char *)local_220,CONCAT44(uStack_214,local_218._M_head_impl));
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar22," have duplicated indices\n",0x19);
        if (local_220 != (undefined1  [8])&local_210) {
          operator_delete((void *)local_220,local_210._M_allocated_capacity + 1);
        }
        if ((undefined1 *)local_250._0_8_ != local_250 + 0x10) {
          operator_delete((void *)local_250._0_8_,(ulong)(local_250._16_8_ + 1));
        }
        pOVar23 = (OpenMDException *)__cxa_allocate_exception(0x28);
        std::__cxx11::stringbuf::str();
        OpenMDException::OpenMDException(pOVar23,(string *)local_250);
        __cxa_throw(pOVar23,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
      }
      lVar15 = (long)(local_200._M_string_length - (long)local_200._M_dataplus._M_p) >> 2;
      if (lVar15 == 3) {
        if (*(char *)(lVar5 + 0x92) == '\0') {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"Error in Molecule ",0x12);
          pcVar10 = (this->Name).data_._M_dataplus._M_p;
          local_250._0_8_ = local_250 + 0x10;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_250,pcVar10,pcVar10 + (this->Name).data_._M_string_length);
          poVar22 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1a8,(char *)local_250._0_8_,local_250._8_8_);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar22,": normal bend should not have ghostVectorSouce\n",0x2f);
          if ((undefined1 *)local_250._0_8_ != local_250 + 0x10) {
            operator_delete((void *)local_250._0_8_,(ulong)(local_250._16_8_ + 1));
          }
          pOVar23 = (OpenMDException *)__cxa_allocate_exception(0x28);
          std::__cxx11::stringbuf::str();
          OpenMDException::OpenMDException(pOVar23,(string *)local_250);
          __cxa_throw(pOVar23,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
        }
      }
      else if (lVar15 == 2) {
        if (*(char *)(lVar5 + 0x92) == '\x01') {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"Error in Molecule ",0x12);
          pcVar10 = (this->Name).data_._M_dataplus._M_p;
          local_250._0_8_ = local_250 + 0x10;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_250,pcVar10,pcVar10 + (this->Name).data_._M_string_length);
          poVar22 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1a8,(char *)local_250._0_8_,local_250._8_8_);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar22,": ghostVectorSouce is missing\n",0x1e);
          if ((undefined1 *)local_250._0_8_ != local_250 + 0x10) {
            operator_delete((void *)local_250._0_8_,(ulong)(local_250._16_8_ + 1));
          }
          pOVar23 = (OpenMDException *)__cxa_allocate_exception(0x28);
          std::__cxx11::stringbuf::str();
          OpenMDException::OpenMDException(pOVar23,(string *)local_250);
          __cxa_throw(pOVar23,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
        }
        local_220 = (undefined1  [8])(long)*(int *)(lVar5 + 0x94);
        if ((ulong)((long)(this->atomStamps_).
                          super__Vector_base<OpenMD::AtomStamp_*,_std::allocator<OpenMD::AtomStamp_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->atomStamps_).
                          super__Vector_base<OpenMD::AtomStamp_*,_std::allocator<OpenMD::AtomStamp_*>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 3) <= (ulong)local_220) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"Error in Molecule ",0x12);
          pcVar10 = (this->Name).data_._M_dataplus._M_p;
          local_250._0_8_ = local_250 + 0x10;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_250,pcVar10,pcVar10 + (this->Name).data_._M_string_length);
          poVar22 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1a8,(char *)local_250._0_8_,local_250._8_8_);
          std::__ostream_insert<char,std::char_traits<char>>(poVar22,": ghostVectorSource ",0x14);
          poVar22 = std::ostream::_M_insert<unsigned_long>((ulong)poVar22);
          std::__ostream_insert<char,std::char_traits<char>>(poVar22,"  is invalid\n",0xd);
          if ((undefined1 *)local_250._0_8_ != local_250 + 0x10) {
            operator_delete((void *)local_250._0_8_,(ulong)(local_250._16_8_ + 1));
          }
          pOVar23 = (OpenMDException *)__cxa_allocate_exception(0x28);
          std::__cxx11::stringbuf::str();
          OpenMDException::OpenMDException(pOVar23,(string *)local_250);
          __cxa_throw(pOVar23,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
        }
        _Var13 = std::
                 __find_if<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_equals_val<unsigned_long_const>>
                           (local_200._M_dataplus._M_p,local_200._M_string_length,local_220);
        if (_Var13._M_current == (int *)local_200._M_string_length) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"Error in Molecule ",0x12);
          pcVar10 = (this->Name).data_._M_dataplus._M_p;
          local_250._0_8_ = local_250 + 0x10;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_250,pcVar10,pcVar10 + (this->Name).data_._M_string_length);
          poVar22 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1a8,(char *)local_250._0_8_,local_250._8_8_);
          std::__ostream_insert<char,std::char_traits<char>>(poVar22,": ghostVectorSouce ",0x13);
          poVar22 = std::ostream::_M_insert<unsigned_long>((ulong)poVar22);
          std::__ostream_insert<char,std::char_traits<char>>(poVar22,"is invalid\n",0xb);
          if ((undefined1 *)local_250._0_8_ != local_250 + 0x10) {
            operator_delete((void *)local_250._0_8_,(ulong)(local_250._16_8_ + 1));
          }
          pOVar23 = (OpenMDException *)__cxa_allocate_exception(0x28);
          std::__cxx11::stringbuf::str();
          OpenMDException::OpenMDException(pOVar23,(string *)local_250);
          __cxa_throw(pOVar23,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
        }
        if ((this->atomStamps_).
            super__Vector_base<OpenMD::AtomStamp_*,_std::allocator<OpenMD::AtomStamp_*>_>._M_impl.
            super__Vector_impl_data._M_start[(int)local_220._0_4_]->haveOrt_ == false) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"Error in Molecule ",0x12);
          pcVar10 = (this->Name).data_._M_dataplus._M_p;
          local_250._0_8_ = local_250 + 0x10;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_250,pcVar10,pcVar10 + (this->Name).data_._M_string_length);
          poVar22 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1a8,(char *)local_250._0_8_,local_250._8_8_);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar22,": ghost atom must be a directional atom\n",0x28);
          if ((undefined1 *)local_250._0_8_ != local_250 + 0x10) {
            operator_delete((void *)local_250._0_8_,(ulong)(local_250._16_8_ + 1));
          }
          pOVar23 = (OpenMDException *)__cxa_allocate_exception(0x28);
          std::__cxx11::stringbuf::str();
          OpenMDException::OpenMDException(pOVar23,(string *)local_250);
          __cxa_throw(pOVar23,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
        }
      }
      if ((int *)local_200._M_dataplus._M_p != (int *)0x0) {
        operator_delete(local_200._M_dataplus._M_p,
                        local_200.field_2._M_allocated_capacity - (long)local_200._M_dataplus._M_p);
      }
      uVar26 = uVar26 + 1;
      ppBVar17 = (this->bendStamps_).
                 super__Vector_base<OpenMD::BendStamp_*,_std::allocator<OpenMD::BendStamp_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      ppBVar24 = (this->bendStamps_).
                 super__Vector_base<OpenMD::BendStamp_*,_std::allocator<OpenMD::BendStamp_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
      lVar25 = lVar25 + 0x100000000;
    } while (uVar26 < (ulong)((long)ppBVar24 - (long)ppBVar17 >> 3));
  }
  if (ppBVar24 == ppBVar17) {
    local_250._24_8_ = local_250 + 8;
    local_250._8_8_ = local_250._8_8_ & 0xffffffff00000000;
    local_250._16_8_ = (_Base_ptr)0x0;
    local_228 = 0;
    local_230 = (_Base_ptr)local_250._24_8_;
    local_1c8 = (_Base_ptr)local_250._24_8_;
  }
  else {
    uVar26 = 0;
    do {
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)&local_200,&ppBVar17[(int)uVar26]->members_);
      local_250._0_8_ = local_250._0_8_ & 0xffffffff00000000;
      std::vector<int,_std::allocator<int>_>::vector
                (&local_1e0,
                 (long)(this->rigidBodyStamps_).
                       super__Vector_base<OpenMD::RigidBodyStamp_*,_std::allocator<OpenMD::RigidBodyStamp_*>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(this->rigidBodyStamps_).
                       super__Vector_base<OpenMD::RigidBodyStamp_*,_std::allocator<OpenMD::RigidBodyStamp_*>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 3,
                 (value_type_conflict1 *)local_250,(allocator_type *)local_220);
      if (local_200._M_dataplus._M_p != (pointer)local_200._M_string_length) {
        piVar6 = (this->atom2Rigidbody).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        _Var16._M_p = local_200._M_dataplus._M_p;
        do {
          lVar25 = (long)piVar6[*(int *)_Var16._M_p];
          if ((-1 < lVar25) &&
             (iVar1 = local_1e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start[lVar25],
             local_1e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_start[lVar25] = iVar1 + 1, 1 < iVar1)) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,"Error in Molecule ",0x12);
            pcVar10 = (this->Name).data_._M_dataplus._M_p;
            local_250._0_8_ = local_250 + 0x10;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_250,pcVar10,pcVar10 + (this->Name).data_._M_string_length);
            poVar22 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_1a8,(char *)local_250._0_8_,local_250._8_8_);
            std::__ostream_insert<char,std::char_traits<char>>(poVar22,": bend",6);
            containerToString<std::vector<int,std::allocator<int>>>
                      ((string *)local_220,(OpenMD *)&local_200,cont);
            poVar22 = std::__ostream_insert<char,std::char_traits<char>>
                                (poVar22,(char *)local_220,
                                 CONCAT44(uStack_214,local_218._M_head_impl));
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar22,"has three atoms on the same rigid body\n",0x27);
            if (local_220 != (undefined1  [8])&local_210) {
              operator_delete((void *)local_220,local_210._M_allocated_capacity + 1);
            }
            if ((undefined1 *)local_250._0_8_ != local_250 + 0x10) {
              operator_delete((void *)local_250._0_8_,(ulong)(local_250._16_8_ + 1));
            }
            pOVar23 = (OpenMDException *)__cxa_allocate_exception(0x28);
            std::__cxx11::stringbuf::str();
            OpenMDException::OpenMDException(pOVar23,(string *)local_250);
            __cxa_throw(pOVar23,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
          }
          _Var16._M_p = _Var16._M_p + 4;
        } while (_Var16._M_p != (pointer)local_200._M_string_length);
      }
      if (local_1e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (int *)0x0) {
        operator_delete(local_1e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_1e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_1e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if ((int *)local_200._M_dataplus._M_p != (int *)0x0) {
        operator_delete(local_200._M_dataplus._M_p,
                        local_200.field_2._M_allocated_capacity - (long)local_200._M_dataplus._M_p);
      }
      uVar26 = uVar26 + 1;
      ppBVar17 = (this->bendStamps_).
                 super__Vector_base<OpenMD::BendStamp_*,_std::allocator<OpenMD::BendStamp_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      ppBVar24 = (this->bendStamps_).
                 super__Vector_base<OpenMD::BendStamp_*,_std::allocator<OpenMD::BendStamp_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
    } while (uVar26 < (ulong)((long)ppBVar24 - (long)ppBVar17 >> 3));
    local_250._24_8_ = local_250 + 8;
    local_250._8_8_ = local_250._8_8_ & 0xffffffff00000000;
    local_250._16_8_ = (_Base_ptr)0x0;
    local_228 = 0;
    local_230 = (_Base_ptr)local_250._24_8_;
    local_1c8 = (_Base_ptr)local_250._24_8_;
    if (ppBVar24 != ppBVar17) {
      lVar25 = 0;
      uVar26 = 0;
      do {
        lVar5 = *(long *)((long)ppBVar17 + (lVar25 >> 0x1d));
        std::vector<int,_std::allocator<int>_>::vector
                  (&local_1e0,(vector<int,_std::allocator<int>_> *)(lVar5 + 0x98));
        if ((long)local_1e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_1e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start == 8) {
          local_220._0_4_ = ((_Head_base<2UL,_int,_false> *)(lVar5 + 0x94))->_M_head_impl;
          _Var13 = std::
                   __find_if<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_equals_val<int_const>>
                             (local_1e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start,
                              local_1e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_finish,local_220);
          if (_Var13._M_current !=
              local_1e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish) {
            std::vector<int,_std::allocator<int>_>::insert
                      (&local_1e0,(const_iterator)_Var13._M_current,
                       (value_type_conflict1 *)local_220);
          }
        }
        _Var2._M_head_impl =
             local_1e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_start[2];
        local_1bc.super__Tuple_impl<0UL,_int,_int,_int>.super__Tuple_impl<1UL,_int,_int>.
        super__Head_base<1UL,_int,_false>._M_head_impl =
             local_1e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_start[1];
        local_1bc.super__Tuple_impl<0UL,_int,_int,_int>.super__Head_base<0UL,_int,_false>.
        _M_head_impl = *local_1e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start;
        local_1bc.super__Tuple_impl<0UL,_int,_int,_int>.super__Tuple_impl<1UL,_int,_int>.
        super__Tuple_impl<2UL,_int>.super__Head_base<2UL,_int,_false>._M_head_impl =
             (_Head_base<2UL,_int,_false>)(_Head_base<2UL,_int,_false>)_Var2._M_head_impl;
        if (_Var2._M_head_impl <
            local_1bc.super__Tuple_impl<0UL,_int,_int,_int>.super__Head_base<0UL,_int,_false>.
            _M_head_impl) {
          local_1bc.super__Tuple_impl<0UL,_int,_int,_int>.super__Tuple_impl<1UL,_int,_int>.
          super__Tuple_impl<2UL,_int>.super__Head_base<2UL,_int,_false>._M_head_impl =
               (_Head_base<2UL,_int,_false>)
               (_Head_base<2UL,_int,_false>)
               local_1bc.super__Tuple_impl<0UL,_int,_int,_int>.super__Head_base<0UL,_int,_false>.
               _M_head_impl;
          local_1bc.super__Tuple_impl<0UL,_int,_int,_int>.super__Head_base<0UL,_int,_false>.
          _M_head_impl = _Var2._M_head_impl;
        }
        iVar18 = std::
                 _Rb_tree<std::tuple<int,_int,_int>,_std::tuple<int,_int,_int>,_std::_Identity<std::tuple<int,_int,_int>_>,_std::less<std::tuple<int,_int,_int>_>,_std::allocator<std::tuple<int,_int,_int>_>_>
                 ::find((_Rb_tree<std::tuple<int,_int,_int>,_std::tuple<int,_int,_int>,_std::_Identity<std::tuple<int,_int,_int>_>,_std::less<std::tuple<int,_int,_int>_>,_std::allocator<std::tuple<int,_int,_int>_>_>
                         *)local_250,&local_1bc);
        if (iVar18._M_node != (_Base_ptr)(local_250 + 8)) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"Error in Molecule ",0x12);
          pcVar10 = (this->Name).data_._M_dataplus._M_p;
          local_220 = (undefined1  [8])&local_210;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_220,pcVar10,pcVar10 + (this->Name).data_._M_string_length);
          poVar22 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1a8,(char *)local_220,
                               CONCAT44(uStack_214,local_218._M_head_impl));
          std::__ostream_insert<char,std::char_traits<char>>(poVar22,": ",2);
          std::__ostream_insert<char,std::char_traits<char>>(poVar22,"Bend",4);
          containerToString<std::vector<int,std::allocator<int>>>
                    (&local_200,(OpenMD *)&local_1e0,cont_02);
          poVar22 = std::__ostream_insert<char,std::char_traits<char>>
                              (poVar22,local_200._M_dataplus._M_p,local_200._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar22," appears multiple times\n",0x18);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_200._M_dataplus._M_p != &local_200.field_2) {
            operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
          }
          if (local_220 != (undefined1  [8])&local_210) {
            operator_delete((void *)local_220,local_210._M_allocated_capacity + 1);
          }
          pOVar23 = (OpenMDException *)__cxa_allocate_exception(0x28);
          std::__cxx11::stringbuf::str();
          OpenMDException::OpenMDException(pOVar23,(string *)local_220);
          __cxa_throw(pOVar23,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
        }
        std::
        _Rb_tree<std::tuple<int,int,int>,std::tuple<int,int,int>,std::_Identity<std::tuple<int,int,int>>,std::less<std::tuple<int,int,int>>,std::allocator<std::tuple<int,int,int>>>
        ::_M_insert_unique<std::tuple<int,int,int>const&>
                  ((_Rb_tree<std::tuple<int,int,int>,std::tuple<int,int,int>,std::_Identity<std::tuple<int,int,int>>,std::less<std::tuple<int,int,int>>,std::allocator<std::tuple<int,int,int>>>
                    *)local_250,&local_1bc);
        if (local_1e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start != (int *)0x0) {
          operator_delete(local_1e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_1e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_1e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        uVar26 = uVar26 + 1;
        ppBVar17 = (this->bendStamps_).
                   super__Vector_base<OpenMD::BendStamp_*,_std::allocator<OpenMD::BendStamp_*>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        lVar25 = lVar25 + 0x100000000;
      } while (uVar26 < (ulong)((long)(this->bendStamps_).
                                      super__Vector_base<OpenMD::BendStamp_*,_std::allocator<OpenMD::BendStamp_*>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (long)ppBVar17 >>
                               3));
    }
  }
  ppBVar19 = (this->bondStamps_).
             super__Vector_base<OpenMD::BondStamp_*,_std::allocator<OpenMD::BondStamp_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  if ((this->bondStamps_).
      super__Vector_base<OpenMD::BondStamp_*,_std::allocator<OpenMD::BondStamp_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppBVar19) {
    uVar26 = 0;
    do {
      _Var2._M_head_impl = ppBVar19[(int)uVar26]->a;
      _Var3._M_head_impl = ppBVar19[(int)uVar26]->b;
      ppAVar7 = (this->atomStamps_).
                super__Vector_base<OpenMD::AtomStamp_*,_std::allocator<OpenMD::AtomStamp_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      pAVar8 = ppAVar7[_Var2._M_head_impl];
      pAVar9 = ppAVar7[_Var3._M_head_impl];
      p_Var21 = *(_Base_ptr *)((long)&(pAVar8->bondedAtoms_)._M_t._M_impl + 0x18);
      local_1b0 = uVar26;
      _Var11._M_head_impl = local_218._M_head_impl;
      while ((p_Var21 != (_Rb_tree_node_base *)((long)&(pAVar8->bondedAtoms_)._M_t._M_impl + 8U) &&
             (local_218._M_head_impl = p_Var21[1]._M_color, local_218._M_head_impl != ~_S_red))) {
        if (_Var3._M_head_impl != local_218._M_head_impl) {
          local_220._4_4_ = _Var2._M_head_impl;
          local_220._0_4_ = _Var3._M_head_impl;
          iVar18 = std::
                   _Rb_tree<std::tuple<int,_int,_int>,_std::tuple<int,_int,_int>,_std::_Identity<std::tuple<int,_int,_int>_>,_std::less<std::tuple<int,_int,_int>_>,_std::allocator<std::tuple<int,_int,_int>_>_>
                   ::find((_Rb_tree<std::tuple<int,_int,_int>,_std::tuple<int,_int,_int>,_std::_Identity<std::tuple<int,_int,_int>_>,_std::less<std::tuple<int,_int,_int>_>,_std::allocator<std::tuple<int,_int,_int>_>_>
                           *)local_250,(key_type *)local_220);
          _Var11._M_head_impl = local_218._M_head_impl;
          if (iVar18._M_node == local_1c8) {
            std::
            _Rb_tree<std::tuple<int,int,int>,std::tuple<int,int,int>,std::_Identity<std::tuple<int,int,int>>,std::less<std::tuple<int,int,int>>,std::allocator<std::tuple<int,int,int>>>
            ::_M_insert_unique<std::tuple<int,int,int>const&>
                      ((_Rb_tree<std::tuple<int,int,int>,std::tuple<int,int,int>,std::_Identity<std::tuple<int,int,int>>,std::less<std::tuple<int,int,int>>,std::allocator<std::tuple<int,int,int>>>
                        *)local_250,(tuple<int,_int,_int> *)local_220);
            pBVar20 = (BendStamp *)operator_new(0xf0);
            BendStamp::BendStamp(pBVar20);
            BendStamp::setMembers(pBVar20,(tuple<int,_int,_int> *)local_220);
            addBendStamp(this,pBVar20);
            _Var11._M_head_impl = local_218._M_head_impl;
          }
        }
        local_218._M_head_impl = _Var11._M_head_impl;
        p_Var21 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var21);
        _Var11._M_head_impl = local_218._M_head_impl;
      }
      local_218._M_head_impl = _Var11._M_head_impl;
      for (p_Var21 = *(_Base_ptr *)((long)&(pAVar9->bondedAtoms_)._M_t._M_impl + 0x18);
          (p_Var21 != (_Rb_tree_node_base *)((long)&(pAVar9->bondedAtoms_)._M_t._M_impl + 8U) &&
          (_Var4.super__Head_base<2UL,_int,_false>._M_head_impl =
                (_Head_base<2UL,_int,_false>)p_Var21[1]._M_color,
          _Var4.super__Head_base<2UL,_int,_false>._M_head_impl != -1));
          p_Var21 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var21)) {
        if ((_Head_base<2UL,_int,_false>)_Var2._M_head_impl !=
            _Var4.super__Head_base<2UL,_int,_false>._M_head_impl) {
          local_220._4_4_ = _Var3._M_head_impl;
          local_220._0_4_ = _Var4.super__Head_base<2UL,_int,_false>._M_head_impl;
          local_218._M_head_impl = _Var2._M_head_impl;
          iVar18 = std::
                   _Rb_tree<std::tuple<int,_int,_int>,_std::tuple<int,_int,_int>,_std::_Identity<std::tuple<int,_int,_int>_>,_std::less<std::tuple<int,_int,_int>_>,_std::allocator<std::tuple<int,_int,_int>_>_>
                   ::find((_Rb_tree<std::tuple<int,_int,_int>,_std::tuple<int,_int,_int>,_std::_Identity<std::tuple<int,_int,_int>_>,_std::less<std::tuple<int,_int,_int>_>,_std::allocator<std::tuple<int,_int,_int>_>_>
                           *)local_250,(key_type *)local_220);
          if (iVar18._M_node == local_1c8) {
            std::
            _Rb_tree<std::tuple<int,int,int>,std::tuple<int,int,int>,std::_Identity<std::tuple<int,int,int>>,std::less<std::tuple<int,int,int>>,std::allocator<std::tuple<int,int,int>>>
            ::_M_insert_unique<std::tuple<int,int,int>const&>
                      ((_Rb_tree<std::tuple<int,int,int>,std::tuple<int,int,int>,std::_Identity<std::tuple<int,int,int>>,std::less<std::tuple<int,int,int>>,std::allocator<std::tuple<int,int,int>>>
                        *)local_250,(tuple<int,_int,_int> *)local_220);
            pBVar20 = (BendStamp *)operator_new(0xf0);
            BendStamp::BendStamp(pBVar20);
            BendStamp::setMembers(pBVar20,(tuple<int,_int,_int> *)local_220);
            addBendStamp(this,pBVar20);
          }
        }
      }
      uVar26 = local_1b0 + 1;
      ppBVar19 = (this->bondStamps_).
                 super__Vector_base<OpenMD::BondStamp_*,_std::allocator<OpenMD::BondStamp_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
    } while (uVar26 < (ulong)((long)(this->bondStamps_).
                                    super__Vector_base<OpenMD::BondStamp_*,_std::allocator<OpenMD::BondStamp_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppBVar19 >> 3
                             ));
  }
  std::
  _Rb_tree<std::tuple<int,_int,_int>,_std::tuple<int,_int,_int>,_std::_Identity<std::tuple<int,_int,_int>_>,_std::less<std::tuple<int,_int,_int>_>,_std::allocator<std::tuple<int,_int,_int>_>_>
  ::~_Rb_tree((_Rb_tree<std::tuple<int,_int,_int>,_std::tuple<int,_int,_int>,_std::_Identity<std::tuple<int,_int,_int>_>,_std::less<std::tuple<int,_int,_int>_>,_std::allocator<std::tuple<int,_int,_int>_>_>
               *)local_250);
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void MoleculeStamp::checkBends() {
    std::ostringstream oss;
    for (std::size_t i = 0; i < getNBends(); ++i) {
      BendStamp* bendStamp       = getBendStamp(i);
      std::vector<int> bendAtoms = bendStamp->getMembers();
      std::vector<int>::iterator j =
          std::find_if(bendAtoms.begin(), bendAtoms.end(),
                       std::bind(std::greater<int>(), std::placeholders::_1,
                                 getNAtoms() - 1));
      std::vector<int>::iterator k =
          std::find_if(bendAtoms.begin(), bendAtoms.end(),
                       std::bind(std::less<int>(), std::placeholders::_1, 0));

      if (j != bendAtoms.end() || k != bendAtoms.end()) {
        oss << "Error in Molecule " << getName() << " : atoms of bend"
            << containerToString(bendAtoms) << " have invalid indices\n";
        throw OpenMDException(oss.str());
      }

      if (hasDuplicateElement(bendAtoms)) {
        oss << "Error in Molecule " << getName() << " : atoms of bend"
            << containerToString(bendAtoms) << " have duplicated indices\n";
        throw OpenMDException(oss.str());
      }

      if (bendAtoms.size() == 2) {
        if (!bendStamp->haveGhostVectorSource()) {
          oss << "Error in Molecule " << getName()
              << ": ghostVectorSouce is missing\n";
          throw OpenMDException(oss.str());
        } else {
          std::size_t ghostIndex = bendStamp->getGhostVectorSource();
          if (ghostIndex < getNAtoms()) {
            if (std::find(bendAtoms.begin(), bendAtoms.end(), ghostIndex) ==
                bendAtoms.end()) {
              oss << "Error in Molecule " << getName() << ": ghostVectorSouce "
                  << ghostIndex << "is invalid\n";
              throw OpenMDException(oss.str());
            }
            if (!getAtomStamp(ghostIndex)->haveOrientation()) {
              oss << "Error in Molecule " << getName()
                  << ": ghost atom must be a directional atom\n";
              throw OpenMDException(oss.str());
            }
          } else {
            oss << "Error in Molecule " << getName() << ": ghostVectorSource "
                << ghostIndex << "  is invalid\n";
            throw OpenMDException(oss.str());
          }
        }
      } else if (bendAtoms.size() == 3 && bendStamp->haveGhostVectorSource()) {
        oss << "Error in Molecule " << getName()
            << ": normal bend should not have ghostVectorSouce\n";
        throw OpenMDException(oss.str());
      }
    }

    for (std::size_t i = 0; i < getNBends(); ++i) {
      BendStamp* bendStamp       = getBendStamp(i);
      std::vector<int> bendAtoms = bendStamp->getMembers();
      std::vector<int> rigidSet(getNRigidBodies(), 0);
      std::vector<int>::iterator j;
      for (j = bendAtoms.begin(); j != bendAtoms.end(); ++j) {
        int rigidbodyIndex = atom2Rigidbody[*j];
        if (rigidbodyIndex >= 0) {
          ++rigidSet[rigidbodyIndex];
          if (rigidSet[rigidbodyIndex] > 2) {
            oss << "Error in Molecule " << getName() << ": bend"
                << containerToString(bendAtoms)
                << "has three atoms on the same rigid body\n";
            throw OpenMDException(oss.str());
          }
        }
      }
    }

    std::set<std::tuple<int, int, int>> allBends;
    std::set<std::tuple<int, int, int>>::iterator iter;

    for (std::size_t i = 0; i < getNBends(); ++i) {
      BendStamp* bendStamp  = getBendStamp(i);
      std::vector<int> bend = bendStamp->getMembers();
      if (bend.size() == 2) {
        // in case we have two ghost bend. For example,
        // bend {
        // members (0, 1);
        //   ghostVectorSource = 0;
        // }
        // and
        // bend {
        //   members (0, 1);
        // ghostVectorSource = 0;
        // }
        // In order to distinguish them. we expand them to Tuple3.
        // the first one is expanded to (0, 0, 1) while the second one
        // is expaned to (0, 1, 1)
        int ghostIndex = bendStamp->getGhostVectorSource();
        std::vector<int>::iterator j =
            std::find(bend.begin(), bend.end(), ghostIndex);
        if (j != bend.end()) { bend.insert(j, ghostIndex); }
      }

      std::tuple<int, int, int> bendTuple {bend[0], bend[1], bend[2]};
      auto& [first, second, third] = bendTuple;

      // make sure the first element of bendTuple is always less than or equal
      // to the third element of bendTuple
      if (first > third) { std::swap(first, third); }

      iter = allBends.find(bendTuple);
      if (iter != allBends.end()) {
        oss << "Error in Molecule " << getName() << ": "
            << "Bend" << containerToString(bend) << " appears multiple times\n";
        throw OpenMDException(oss.str());
      } else {
        allBends.insert(bendTuple);
      }
    }

    for (std::size_t i = 0; i < getNBonds(); ++i) {
      BondStamp* bondStamp = getBondStamp(i);
      int a                = bondStamp->getA();
      int b                = bondStamp->getB();

      AtomStamp* atomA = getAtomStamp(a);
      AtomStamp* atomB = getAtomStamp(b);

      // find bend c--a--b
      AtomStamp::AtomIter ai;
      for (int c = atomA->getFirstBondedAtom(ai); c != -1;
           c     = atomA->getNextBondedAtom(ai)) {
        if (b == c) continue;

        std::tuple<int, int, int> newBend {c, a, b};
        auto [first, second, third] = newBend;
        if (first > third) { std::swap(first, third); }

        if (allBends.find(newBend) == allBends.end()) {
          allBends.insert(newBend);
          BendStamp* newBendStamp = new BendStamp();
          newBendStamp->setMembers(newBend);
          addBendStamp(newBendStamp);
        }
      }

      // find bend a--b--c
      for (int c = atomB->getFirstBondedAtom(ai); c != -1;
           c     = atomB->getNextBondedAtom(ai)) {
        if (a == c) continue;

        std::tuple<int, int, int> newBend {a, b, c};
        auto [first, second, third] = newBend;
        if (first > third) { std::swap(first, third); }

        if (allBends.find(newBend) == allBends.end()) {
          allBends.insert(newBend);
          BendStamp* newBendStamp = new BendStamp();
          newBendStamp->setMembers(newBend);
          addBendStamp(newBendStamp);
        }
      }
    }
  }